

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniDFS.cpp
# Opt level: O1

void __thiscall DataServer::operator()(DataServer *this)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  __mode_t __mode;
  unique_lock<std::mutex> *__path;
  unique_lock<std::mutex> lk;
  unique_lock<std::mutex> local_40;
  
  do {
    local_40._M_device = &nd_m;
    local_40._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_40);
    local_40._M_owns = true;
    __path = &local_40;
    std::condition_variable::operator()
              ((condition_variable *)nd_cv,&local_40,(anon_class_8_1_8991fb9c)this);
    if (ispropercmd == true) {
      if ((type == put2) || (type == put)) {
        saveFile(this);
      }
      else {
        if ((type != read2) && (type != read)) goto LAB_00119cac;
        if ((is_ready_read == true) && (server_executing_read == this->serverId)) {
          readFileAndOutput(this);
        }
      }
    }
    else {
LAB_00119cac:
      if ((ispropercmd != false) && (type == mkdir)) {
        mkdir(this,(char *)__path,__mode);
      }
    }
    uVar3 = (ulong)this->serverId;
    uVar2 = uVar3 + 0x3f;
    if (-1 < (long)uVar3) {
      uVar2 = uVar3;
    }
    bVar1 = (byte)this->serverId & 0x3f;
    dataNotified.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p
    [((long)uVar2 >> 6) + ((ulong)((uVar3 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
         dataNotified.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p
         [((long)uVar2 >> 6) + ((ulong)((uVar3 & 0x800000000000003f) < 0x8000000000000001) - 1)] &
         (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
    std::unique_lock<std::mutex>::unlock(&local_40);
    std::condition_variable::notify_all();
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
  } while( true );
}

Assistant:

void operator() () const
    {
        for (;;)
        {
            unique_lock<mutex> lk(nd_m);
            nd_cv.wait(lk, [this]{return dataNotified[serverId];});

            if (ispropercmd && (type == MsgType::put || type == MsgType::put2))
            {
                saveFile();
            }
            else if (ispropercmd && (type == MsgType::read || type == MsgType::read2)){

                if (is_ready_read && server_executing_read == serverId)
                {
                    //cout << "is ready read and my id is " << serverId << endl;
                    readFileAndOutput();
                }
            }
            else if (ispropercmd && type == MsgType::mkdir)
            {
                mkdir();
            }
            //cout << serverId << " data notified \n";
            dataNotified[serverId] = false;
            lk.unlock();
            nd_cv.notify_all();
        }

    }